

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall duckdb::Node::ReplaceChild(Node *this,ART *art,uint8_t byte,Node child)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  NType NVar2;
  long lVar3;
  type paVar4;
  pointer pFVar5;
  data_ptr_t pdVar6;
  long *plVar7;
  ulong uVar8;
  InternalException *this_00;
  IndexPointer IVar9;
  long *plVar10;
  uint uVar11;
  long lVar12;
  string local_68;
  string local_48;
  
  uVar8 = (this->super_IndexPointer).data;
  NVar2 = (NType)(uVar8 >> 0x38);
  uVar11 = (uint)(uVar8 >> 0x20);
  switch(NVar2 & 0x7f) {
  case NODE_4:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[2].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar8 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar7; (uVar8 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar7 = plVar10;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    if ((ulong)pdVar6[(_Var1._M_head_impl)->bitmask_offset + lVar12] != 0) {
      lVar3 = (_Var1._M_head_impl)->bitmask_offset + lVar12;
      uVar8 = 0;
      do {
        if (pdVar6[uVar8 + lVar3 + 1] == byte) {
          lVar12 = *(long *)(pdVar6 + uVar8 * 8 + lVar3 + 8);
          ((IndexPointer *)(pdVar6 + uVar8 * 8 + lVar3 + 8))->data =
               (idx_t)child.super_IndexPointer.data;
          if ((ulong)child.super_IndexPointer.data >> 0x38 == 0 || -1 < lVar12) {
            return;
          }
          *(ulong *)(pdVar6 + uVar8 * 8 + lVar3 + 8) =
               (ulong)child.super_IndexPointer.data | 0x8000000000000000;
          return;
        }
        uVar8 = uVar8 + 1;
      } while (pdVar6[(_Var1._M_head_impl)->bitmask_offset + lVar12] != uVar8);
    }
    break;
  case NODE_16:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[3].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar8 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar7; (uVar8 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar7 = plVar10;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    if ((ulong)pdVar6[(_Var1._M_head_impl)->bitmask_offset + lVar12] != 0) {
      lVar3 = (_Var1._M_head_impl)->bitmask_offset + lVar12;
      uVar8 = 0;
      do {
        if (pdVar6[uVar8 + lVar3 + 1] == byte) {
          lVar12 = *(long *)(pdVar6 + uVar8 * 8 + lVar3 + 0x18);
          ((IndexPointer *)(pdVar6 + uVar8 * 8 + lVar3 + 0x18))->data =
               (idx_t)child.super_IndexPointer.data;
          if ((ulong)child.super_IndexPointer.data >> 0x38 == 0 || -1 < lVar12) {
            return;
          }
          *(ulong *)(pdVar6 + uVar8 * 8 + lVar3 + 0x18) =
               (ulong)child.super_IndexPointer.data | 0x8000000000000000;
          return;
        }
        uVar8 = uVar8 + 1;
      } while (pdVar6[(_Var1._M_head_impl)->bitmask_offset + lVar12] != uVar8);
    }
    break;
  case NODE_48:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[4].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar8 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar7; (uVar8 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar7 = plVar10;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    IVar9.data = (ulong)child.super_IndexPointer.data | 0x8000000000000000;
    if ((ulong)child.super_IndexPointer.data >> 0x38 == 0) {
      IVar9 = child.super_IndexPointer.data;
    }
    if (-1 < *(long *)(pdVar6 + (ulong)pdVar6[(ulong)byte + 1 + lVar12] * 8 + lVar12 + 0x108)) {
      IVar9 = child.super_IndexPointer.data;
    }
    *(idx_t *)(pdVar6 + (ulong)pdVar6[(ulong)byte + 1 + lVar12] * 8 + lVar12 + 0x108) = IVar9.data;
    break;
  case NODE_256:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[5].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar8 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar7; (uVar8 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar7 = plVar10;
    }
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
    pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
    lVar12 = (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    IVar9.data = (ulong)child.super_IndexPointer.data | 0x8000000000000000;
    if ((ulong)child.super_IndexPointer.data >> 0x38 == 0) {
      IVar9 = child.super_IndexPointer.data;
    }
    if (-1 < *(long *)(pdVar6 + (ulong)byte * 8 + lVar12 + 8)) {
      IVar9 = child.super_IndexPointer.data;
    }
    *(idx_t *)(pdVar6 + (ulong)byte * 8 + lVar12 + 8) = IVar9.data;
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid node type for ReplaceChild: %s.","");
    EnumUtil::ToString<duckdb::NType>(&local_48,NVar2 & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}